

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O3

sysbvm_tuple_t sysbvm_type_createAnonymous(sysbvm_context_t *context)

{
  sysbvm_object_tuple_t *psVar1;
  
  psVar1 = sysbvm_context_allocatePointerTuple(context,(context->roots).typeType,0x1d);
  psVar1[2].header.field_0 =
       (anon_union_8_3_721b4b48_for_sysbvm_tuple_header_s_0)(context->roots).anyValueType;
  psVar1[4].field_1.pointers[0] = 0xb;
  psVar1[3].field_1.pointers[0] = 0xb;
  psVar1[4].header.field_0.typePointer = 0xb;
  psVar1[4].header.identityHashAndFlags = 0xb;
  psVar1[4].header.objectSize = 0;
  return (sysbvm_tuple_t)psVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_type_createAnonymous(sysbvm_context_t *context)
{
    sysbvm_type_tuple_t* result = (sysbvm_type_tuple_t*)sysbvm_context_allocatePointerTuple(context, context->roots.typeType, SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_type_tuple_t));
    result->supertype = context->roots.anyValueType;
    result->flags = sysbvm_tuple_bitflags_encode(0);
    result->totalSlotCount = sysbvm_tuple_size_encode(context, 0);
    result->instanceSize = sysbvm_tuple_size_encode(context, 0);
    result->instanceAlignment = sysbvm_tuple_size_encode(context, 0);
    return (sysbvm_tuple_t)result;
}